

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O1

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,vector<char_*,_std::allocator<char_*>_> *variable,
          string *value)

{
  pointer *pppcVar1;
  iterator __position;
  char *__dest;
  char *var;
  char *local_20;
  
  __dest = (char *)operator_new__(value->_M_string_length + 1);
  local_20 = __dest;
  strcpy(__dest,(value->_M_dataplus)._M_p);
  __position._M_current =
       (variable->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (variable->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
              ((vector<char*,std::allocator<char*>> *)variable,__position,&local_20);
  }
  else {
    *__position._M_current = __dest;
    pppcVar1 = &(variable->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(
  std::vector<char*>* variable, const std::string& value)
{
  char* var = new char[ value.size() + 1 ];
  strcpy(var, value.c_str());
  variable->push_back(var);
}